

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O0

ze_result_t zesGetFirmwareProcAddrTable(ze_api_version_t version,zes_firmware_dditable_t *pDdiTable)

{
  ze_api_version_t *pzVar1;
  ze_result_t result;
  zes_firmware_dditable_t *dditable;
  zes_firmware_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  pzVar1 = validation_layer::context;
  if (pDdiTable == (zes_firmware_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (((int)*validation_layer::context >> 0x10 == (int)version >> 0x10) &&
          ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
    *(zes_pfnFirmwareGetProperties_t *)(validation_layer::context + 0x2e6) =
         pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties = validation_layer::zesFirmwareGetProperties;
    *(zes_pfnFirmwareFlash_t *)(pzVar1 + 0x2e8) = pDdiTable->pfnFlash;
    pDdiTable->pfnFlash = validation_layer::zesFirmwareFlash;
    *(zes_pfnFirmwareGetFlashProgress_t *)(pzVar1 + 0x2ea) = pDdiTable->pfnGetFlashProgress;
    pDdiTable->pfnGetFlashProgress = validation_layer::zesFirmwareGetFlashProgress;
    *(zes_pfnFirmwareGetConsoleLogs_t *)(pzVar1 + 0x2ec) = pDdiTable->pfnGetConsoleLogs;
    pDdiTable->pfnGetConsoleLogs = validation_layer::zesFirmwareGetConsoleLogs;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetFirmwareProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_firmware_dditable_t* pDdiTable              ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zesDdiTable.Firmware;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = validation_layer::zesFirmwareGetProperties;

    dditable.pfnFlash                                    = pDdiTable->pfnFlash;
    pDdiTable->pfnFlash                                  = validation_layer::zesFirmwareFlash;

    dditable.pfnGetFlashProgress                         = pDdiTable->pfnGetFlashProgress;
    pDdiTable->pfnGetFlashProgress                       = validation_layer::zesFirmwareGetFlashProgress;

    dditable.pfnGetConsoleLogs                           = pDdiTable->pfnGetConsoleLogs;
    pDdiTable->pfnGetConsoleLogs                         = validation_layer::zesFirmwareGetConsoleLogs;

    return result;
}